

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cc
# Opt level: O0

Token __thiscall flow::lang::Lexer::parseString(Lexer *this,Token result)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  bool local_32;
  int local_24;
  int last;
  int delim;
  Token result_local;
  Lexer *this_local;
  
  iVar2 = currentChar(this);
  local_24 = -1;
  nextChar(this,true);
  std::__cxx11::string::clear();
  while( true ) {
    bVar1 = eof(this);
    local_32 = false;
    if (!bVar1) {
      iVar3 = currentChar(this);
      local_32 = iVar3 != iVar2 || local_24 == 0x5c;
    }
    if (!local_32) break;
    iVar3 = currentChar(this);
    std::__cxx11::string::operator+=((string *)&this->stringValue_,(char)iVar3);
    local_24 = currentChar(this);
    nextChar(this,true);
  }
  iVar3 = currentChar(this);
  if (iVar3 == iVar2) {
    nextChar(this,true);
    this->token_ = result;
    this_local._4_4_ = result;
  }
  else {
    this->token_ = Unknown;
    this_local._4_4_ = Unknown;
  }
  return this_local._4_4_;
}

Assistant:

Token Lexer::parseString(Token result) {
  int delim = currentChar();
  int last = -1;

  nextChar();  // skip left delimiter
  stringValue_.clear();

  while (!eof() && (currentChar() != delim || (last == '\\'))) {
    stringValue_ += static_cast<char>(currentChar());

    last = currentChar();
    nextChar();
  }

  if (currentChar() == delim) {
    nextChar();

    return token_ = result;
  }

  return token_ = Token::Unknown;
}